

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O3

Data * Data::divide(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Data *pDVar2;
  long lVar3;
  Data *pDVar4;
  pointer ppDVar5;
  
  ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (*ppDVar5 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    pDVar4 = (Data *)0x0;
    lVar3 = __dynamic_cast(*ppDVar5,&typeinfo,&Integer::typeinfo,0);
    if (lVar3 != 0) {
      pDVar4 = Integer::divide(dataPara);
      ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
  }
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar5 != ppDVar1) {
    do {
      pDVar2 = *ppDVar5;
      if ((pDVar2 != (Data *)0x0) && (pDVar2->cited == 0)) {
        (*pDVar2->_vptr_Data[1])();
      }
      ppDVar5 = ppDVar5 + 1;
    } while (ppDVar5 != ppDVar1);
    ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppDVar5 != (pointer)0x0) {
    operator_delete(ppDVar5);
  }
  operator_delete(dataPara);
  return pDVar4;
}

Assistant:

Data *Data::divide(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0])) != NULL) {
        result = Integer::divide(dataPara);
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}